

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O1

void __thiscall Clasp::Asp::PrgAtom::removeDep(PrgAtom *this,Var bodyId,bool pos)

{
  size_type *psVar1;
  pointer pLVar2;
  Literal *__dest;
  Literal *pLVar3;
  size_t __n;
  
  pLVar2 = (this->deps_).ebo_.buf;
  __dest = std::__find_if<Clasp::Literal*,__gnu_cxx::__ops::_Iter_equals_val<Clasp::Literal_const>>
                     (pLVar2,pLVar2 + (this->deps_).ebo_.size);
  pLVar3 = (this->deps_).ebo_.buf + (this->deps_).ebo_.size;
  if (__dest != pLVar3) {
    __n = (long)pLVar3 - (long)(__dest + 1);
    if (0 < (long)__n) {
      memmove(__dest,__dest + 1,__n);
    }
    psVar1 = &(this->deps_).ebo_.size;
    *psVar1 = *psVar1 - 1;
  }
  return;
}

Assistant:

void PrgAtom::removeDep(Var bodyId, bool pos) {
	LitVec::iterator it = std::find(deps_.begin(), deps_.end(), Literal(bodyId, !pos));
	if (it != deps_.end()) { deps_.erase(it); }
}